

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSetup_SPGMR(SUNLinearSolver S,SUNMatrix A)

{
  int iVar1;
  undefined4 uVar2;
  long *in_RDI;
  void *PData;
  SUNPSetupFn Psetup;
  int status;
  SUNContext sunctx_local_scope_;
  int local_4;
  
  if ((*(code **)(*in_RDI + 0x38) == (code *)0x0) ||
     (iVar1 = (**(code **)(*in_RDI + 0x38))(*(undefined8 *)(*in_RDI + 0x48)), iVar1 == 0)) {
    *(undefined4 *)(*in_RDI + 0x20) = 0;
    local_4 = 0;
  }
  else {
    uVar2 = 0x324;
    if (iVar1 < 0) {
      uVar2 = 0xfffffcda;
    }
    *(undefined4 *)(*in_RDI + 0x20) = uVar2;
    local_4 = *(int *)(*in_RDI + 0x20);
  }
  return local_4;
}

Assistant:

int SUNLinSolSetup_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);

  int status = SUN_SUCCESS;

  /* Set shortcuts to SPGMR memory structures */
  SUNPSetupFn Psetup = SPGMR_CONTENT(S)->Psetup;
  void* PData        = SPGMR_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL)
  {
    status = Psetup(PData);
    if (status != 0)
    {
      LASTFLAG(S) = (status < 0) ? SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  /* return with success */
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}